

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void file_data_resize(FileData *file_data,size_t new_size)

{
  ulong uVar1;
  u8 *puVar2;
  
  uVar1 = file_data->size;
  puVar2 = (u8 *)realloc(file_data->data,new_size);
  file_data->data = puVar2;
  if (uVar1 <= new_size && new_size - uVar1 != 0) {
    memset(puVar2 + uVar1,0,new_size - uVar1);
  }
  file_data->size = new_size;
  return;
}

Assistant:

void file_data_resize(FileData* file_data, size_t new_size) {
  size_t old_size = file_data->size;
  file_data->data = xrealloc(file_data->data, new_size);
  if (new_size > old_size) {
    memset(file_data->data + old_size, 0, new_size - old_size);
  }
  file_data->size = new_size;
}